

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::ClipperOffset::Execute(ClipperOffset *this,Paths *solution,double delta)

{
  reference pvVar1;
  size_type sVar2;
  __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
  local_1d8;
  const_iterator local_1d0;
  IntPoint local_1c8;
  IntPoint local_1b8;
  IntPoint local_1a8;
  IntPoint local_198;
  allocator<ClipperLib::IntPoint> local_181;
  undefined1 local_180 [8];
  Path outer;
  IntRect r;
  undefined1 local_138 [8];
  Clipper clpr;
  double delta_local;
  Paths *solution_local;
  ClipperOffset *this_local;
  
  clpr._272_8_ = delta;
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::clear(solution);
  FixOrientations(this);
  DoOffset(this,(double)clpr._272_8_);
  Clipper::Clipper((Clipper *)local_138,0);
  ClipperBase::AddPaths
            ((ClipperBase *)(local_138 + (long)*(_func_int **)((long)local_138 + -0x18)),
             &this->m_destPolys,ptSubject,true);
  if ((double)clpr._272_8_ <= 0.0) {
    ClipperBase::GetBounds
              ((IntRect *)
               &outer.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (ClipperBase *)(local_138 + (long)*(_func_int **)((long)local_138 + -0x18)));
    std::allocator<ClipperLib::IntPoint>::allocator(&local_181);
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
              ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)local_180,4,
               &local_181);
    std::allocator<ClipperLib::IntPoint>::~allocator(&local_181);
    IntPoint::IntPoint(&local_198,
                       (cInt)((long)&outer.
                                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].X + 6),
                       r.right + 10);
    pvVar1 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                        local_180,0);
    pvVar1->X = local_198.X;
    pvVar1->Y = local_198.Y;
    IntPoint::IntPoint(&local_1a8,r.top + 10,r.right + 10);
    pvVar1 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                        local_180,1);
    pvVar1->X = local_1a8.X;
    pvVar1->Y = local_1a8.Y;
    IntPoint::IntPoint(&local_1b8,r.top + 10,r.left + -10);
    pvVar1 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                        local_180,2);
    pvVar1->X = local_1b8.X;
    pvVar1->Y = local_1b8.Y;
    IntPoint::IntPoint(&local_1c8,
                       (cInt)((long)&outer.
                                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].X + 6),
                       r.left + -10);
    pvVar1 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                        local_180,3);
    pvVar1->X = local_1c8.X;
    pvVar1->Y = local_1c8.Y;
    ClipperBase::AddPath
              ((ClipperBase *)(local_138 + (long)*(_func_int **)((long)local_138 + -0x18)),
               (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)local_180,
               ptSubject,true);
    Clipper::ReverseSolution((Clipper *)local_138,true);
    Clipper::Execute((Clipper *)local_138,ctUnion,solution,pftNegative,pftNegative);
    sVar2 = std::
            vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ::size(solution);
    if (sVar2 != 0) {
      local_1d8._M_current =
           (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
           std::
           vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ::begin(solution);
      __gnu_cxx::
      __normal_iterator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>const*,std::vector<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>,std::allocator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>>
      ::__normal_iterator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>*>
                ((__normal_iterator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>const*,std::vector<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>,std::allocator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>>
                  *)&local_1d0,&local_1d8);
      std::
      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ::erase(solution,local_1d0);
    }
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
              ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)local_180);
  }
  else {
    Clipper::Execute((Clipper *)local_138,ctUnion,solution,pftPositive,pftPositive);
  }
  Clipper::~Clipper((Clipper *)local_138);
  return;
}

Assistant:

void ClipperOffset::Execute(Paths& solution, double delta)
{
  solution.clear();
  FixOrientations();
  DoOffset(delta);
  
  //now clean up 'corners' ...
  Clipper clpr;
  clpr.AddPaths(m_destPolys, ptSubject, true);
  if (delta > 0)
  {
    clpr.Execute(ctUnion, solution, pftPositive, pftPositive);
  }
  else
  {
    IntRect r = clpr.GetBounds();
    Path outer(4);
    outer[0] = IntPoint(r.left - 10, r.bottom + 10);
    outer[1] = IntPoint(r.right + 10, r.bottom + 10);
    outer[2] = IntPoint(r.right + 10, r.top - 10);
    outer[3] = IntPoint(r.left - 10, r.top - 10);

    clpr.AddPath(outer, ptSubject, true);
    clpr.ReverseSolution(true);
    clpr.Execute(ctUnion, solution, pftNegative, pftNegative);
    if (solution.size() > 0) solution.erase(solution.begin());
  }
}